

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O2

Pointer __thiscall
dg::pta::LLVMPointerGraphBuilder::handleConstantBitCast(LLVMPointerGraphBuilder *this,CastInst *BC)

{
  char cVar1;
  bool bVar2;
  DataLayout *DL;
  Value *val;
  PSNode *pPVar3;
  Pointer PVar4;
  const_iterator cStack_28;
  
  cVar1 = llvm::CastInst::isLosslessCast();
  if (cVar1 == '\0') {
    DL = (DataLayout *)llvm::Module::getDataLayout();
    bVar2 = llvmutils::typeCanBePointer(DL,*(Type **)BC);
    if (!bVar2) {
      PVar4.offset.offset = _warn;
      PVar4.target = UnknownPointer;
      return PVar4;
    }
  }
  val = (Value *)llvm::Value::stripPointerCasts();
  pPVar3 = getOperand(this,val);
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::begin(&cStack_28,&(pPVar3->pointsTo).pointers);
  PVar4 = PointerIdPointsToSet::const_iterator::operator*((const_iterator *)&cStack_28);
  return PVar4;
}

Assistant:

Pointer
LLVMPointerGraphBuilder::handleConstantBitCast(const llvm::CastInst *BC) {
    using namespace llvm;

    if (!BC->isLosslessCast()) {
        // If this is a cast to a bigger type (if that can ever happen?),
        // then preserve the pointer. Otherwise, the pointer is cropped,
        // and there's nothing we can do...
        if (!llvmutils::typeCanBePointer(&M->getDataLayout(), BC->getType()))
            return UnknownPointer;
        // fall-through
    }

    const Value *llvmOp = BC->stripPointerCasts();
    // (possibly recursively) get the operand of this bit-cast
    PSNode *op = getOperand(llvmOp);
    assert(op->pointsTo.size() == 1 &&
           "Constant BitCast with not only one pointer");

    return *op->pointsTo.begin();
}